

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

int AF_AActor_SpawnTeleportFog
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  AActor *mobj;
  DVector3 local_30;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      mobj = (AActor *)(param->field_0).field_1.a;
      if ((param->field_0).field_1.atag == 1) {
        if (mobj == (AActor *)0x0) goto LAB_00456b85;
        bVar1 = DObject::IsKindOf((DObject *)mobj,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00456c3e;
        }
      }
      else {
        if (mobj != (AActor *)0x0) goto LAB_00456c2e;
LAB_00456b85:
        mobj = (AActor *)0x0;
      }
      if (numparam == 1) {
        __assertion = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if ((uint)numparam < 3) {
            __assertion = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                __assertion = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if ((uint)numparam < 5) {
                    __assertion = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\0') {
                      if (numparam == 5) {
                        __assertion = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          local_30.X = (double)param[1].field_0.field_1.a;
                          local_30.Y = (double)param[2].field_0.field_1.a;
                          local_30.Z = (double)param[3].field_0.field_1.a;
                          P_SpawnTeleportFog(mobj,&local_30,param[4].field_0.i != 0,
                                             param[5].field_0.i != 0);
                          return 0;
                        }
                        __assertion = "param[paramnum].Type == REGT_INT";
                      }
                      __line = 0x6a;
                      goto LAB_00456cfe;
                    }
                    __assertion = "param[paramnum].Type == REGT_INT";
                  }
                  __line = 0x69;
                  goto LAB_00456cfe;
                }
                __assertion = "param[paramnum].Type == REGT_FLOAT";
              }
              __line = 0x68;
              goto LAB_00456cfe;
            }
            __assertion = "param[paramnum].Type == REGT_FLOAT";
          }
          __line = 0x67;
          goto LAB_00456cfe;
        }
        __assertion = "param[paramnum].Type == REGT_FLOAT";
      }
      __line = 0x66;
      goto LAB_00456cfe;
    }
LAB_00456c2e:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00456c3e:
  __line = 0x65;
LAB_00456cfe:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                ,__line,
                "int AF_AActor_SpawnTeleportFog(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnTeleportFog)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(before);
	PARAM_BOOL(settarget);
	P_SpawnTeleportFog(self, DVector3(x, y, z), before, settarget);
	return 0;
}